

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

ThreadContext * __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::append
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this)

{
  ThreadContext *pTVar1;
  
  pTVar1 = allocateFreeItem(this);
  Future<void>::Private::ThreadPool::ThreadContext::ThreadContext(pTVar1);
  pTVar1 = linkFreeItem(this,pTVar1);
  return pTVar1;
}

Assistant:

T& append() {return linkFreeItem(new (allocateFreeItem()) T);}